

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryRequirementsTests.cpp
# Opt level: O0

void vkt::memory::anon_unknown_0::verifyBufferRequirements
               (ResultCollector *result,VkPhysicalDeviceMemoryProperties *deviceMemoryProperties,
               VkMemoryRequirements *requirements,VkMemoryRequirements *allUsageFlagsRequirements,
               VkPhysicalDeviceLimits *limits,VkBufferCreateFlags bufferFlags,
               VkBufferUsageFlags usage)

{
  deUint32 dVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  byte bVar6;
  VkMemoryRequirements *pVVar7;
  VkPhysicalDeviceMemoryProperties *pVVar8;
  bool bVar9;
  deBool dVar10;
  reference puVar11;
  byte local_2d9;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  allocator<char> local_1b1;
  string local_1b0;
  allocator<char> local_189;
  string local_188;
  allocator<char> local_161;
  string local_160;
  allocator<char> local_139;
  string local_138;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  uint local_c8;
  allocator<char> local_c1;
  VkMemoryPropertyFlags memoryPropertyFlags;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_a0;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_98;
  IndexIterator memoryTypeNdx;
  undefined1 local_88 [6];
  bool hostVisibleCoherentMemoryFound;
  bool deviceLocalMemoryFound;
  vector<unsigned_int,_std::allocator<unsigned_int>_> usedMemoryTypeIndices;
  allocator<char> local_59;
  string local_58;
  VkBufferCreateFlags local_34;
  VkPhysicalDeviceLimits *pVStack_30;
  VkBufferCreateFlags bufferFlags_local;
  VkPhysicalDeviceLimits *limits_local;
  VkMemoryRequirements *allUsageFlagsRequirements_local;
  VkMemoryRequirements *requirements_local;
  VkPhysicalDeviceMemoryProperties *deviceMemoryProperties_local;
  ResultCollector *result_local;
  
  dVar1 = requirements->memoryTypeBits;
  local_34 = bufferFlags;
  pVStack_30 = limits;
  limits_local = (VkPhysicalDeviceLimits *)allUsageFlagsRequirements;
  allUsageFlagsRequirements_local = requirements;
  requirements_local = (VkMemoryRequirements *)deviceMemoryProperties;
  deviceMemoryProperties_local = (VkPhysicalDeviceMemoryProperties *)result;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"VkMemoryRequirements memoryTypeBits has no bits set",&local_59);
  bVar9 = tcu::ResultCollector::check(result,dVar1 != 0,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  if (bVar9) {
    bitsToIndices((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88,
                  allUsageFlagsRequirements_local->memoryTypeBits);
    memoryTypeNdx._M_current._7_1_ = 0;
    memoryTypeNdx._M_current._6_1_ = 0;
    local_98._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88);
    while( true ) {
      local_a0._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88);
      bVar9 = __gnu_cxx::operator!=(&local_98,&local_a0);
      pVVar8 = deviceMemoryProperties_local;
      if (!bVar9) break;
      puVar11 = __gnu_cxx::
                __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                ::operator*(&local_98);
      pVVar8 = deviceMemoryProperties_local;
      pVVar7 = requirements_local;
      if (*puVar11 < (uint)requirements_local->size) {
        puVar11 = __gnu_cxx::
                  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  ::operator*(&local_98);
        pVVar8 = deviceMemoryProperties_local;
        local_c8 = *(uint *)((long)&pVVar7->size + (ulong)*puVar11 * 8 + 4);
        if ((local_c8 & 1) != 0) {
          memoryTypeNdx._M_current._7_1_ = 1;
        }
        if ((local_c8 & 6) != 0) {
          memoryTypeNdx._M_current._6_1_ = 1;
        }
        uVar2 = local_c8 & 0x10;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e8,
                   "Memory type includes VK_MEMORY_PROPERTY_LAZILY_ALLOCATED_BIT",&local_e9);
        tcu::ResultCollector::check((ResultCollector *)pVVar8,uVar2 == 0,&local_e8);
        std::__cxx11::string::~string((string *)&local_e8);
        std::allocator<char>::~allocator(&local_e9);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&memoryPropertyFlags,
                   "VkMemoryRequirements memoryTypeBits contains bits for non-existing memory types"
                   ,&local_c1);
        tcu::ResultCollector::fail((ResultCollector *)pVVar8,(string *)&memoryPropertyFlags);
        std::__cxx11::string::~string((string *)&memoryPropertyFlags);
        std::allocator<char>::~allocator(&local_c1);
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&local_98);
    }
    dVar10 = deIsPowerOfTwo64(allUsageFlagsRequirements_local->alignment);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,"VkMemoryRequirements alignment isn\'t power of two",&local_111)
    ;
    tcu::ResultCollector::check((ResultCollector *)pVVar8,dVar10 == 1,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator(&local_111);
    pVVar8 = deviceMemoryProperties_local;
    if ((usage & 4) != 0) {
      uVar4 = allUsageFlagsRequirements_local->alignment;
      uVar5 = pVStack_30->minTexelBufferOffsetAlignment;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,
                 "VkMemoryRequirements alignment doesn\'t respect minTexelBufferOffsetAlignment",
                 &local_139);
      tcu::ResultCollector::check((ResultCollector *)pVVar8,uVar5 <= uVar4,&local_138);
      std::__cxx11::string::~string((string *)&local_138);
      std::allocator<char>::~allocator(&local_139);
    }
    pVVar8 = deviceMemoryProperties_local;
    if ((usage & 0x10) != 0) {
      uVar4 = allUsageFlagsRequirements_local->alignment;
      uVar5 = pVStack_30->minUniformBufferOffsetAlignment;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_160,
                 "VkMemoryRequirements alignment doesn\'t respect minUniformBufferOffsetAlignment",
                 &local_161);
      tcu::ResultCollector::check((ResultCollector *)pVVar8,uVar5 <= uVar4,&local_160);
      std::__cxx11::string::~string((string *)&local_160);
      std::allocator<char>::~allocator(&local_161);
    }
    pVVar8 = deviceMemoryProperties_local;
    if ((usage & 0x20) != 0) {
      uVar4 = allUsageFlagsRequirements_local->alignment;
      uVar5 = pVStack_30->minStorageBufferOffsetAlignment;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_188,
                 "VkMemoryRequirements alignment doesn\'t respect minStorageBufferOffsetAlignment",
                 &local_189);
      tcu::ResultCollector::check((ResultCollector *)pVVar8,uVar5 <= uVar4,&local_188);
      std::__cxx11::string::~string((string *)&local_188);
      std::allocator<char>::~allocator(&local_189);
    }
    pVVar8 = deviceMemoryProperties_local;
    bVar6 = memoryTypeNdx._M_current._7_1_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,
               "None of the required memory types included VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT",
               &local_1b1);
    tcu::ResultCollector::check((ResultCollector *)pVVar8,(bool)(bVar6 & 1),&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::allocator<char>::~allocator(&local_1b1);
    pVVar8 = deviceMemoryProperties_local;
    local_2d9 = 1;
    if ((local_34 & 1) == 0) {
      local_2d9 = memoryTypeNdx._M_current._6_1_;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,
               "Required memory type doesn\'t include VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT and VK_MEMORY_PROPERTY_HOST_COHERENT_BIT"
               ,&local_1d9);
    tcu::ResultCollector::check((ResultCollector *)pVVar8,(bool)(local_2d9 & 1),&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::~allocator(&local_1d9);
    pVVar8 = deviceMemoryProperties_local;
    uVar2 = allUsageFlagsRequirements_local->memoryTypeBits;
    uVar3 = limits_local->maxImageArrayLayers;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,
               "Memory type bits aren\'t a superset of memory type bits for all usage flags combined"
               ,&local_201);
    tcu::ResultCollector::check((ResultCollector *)pVVar8,(uVar3 & ~uVar2) == 0,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator(&local_201);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88);
  }
  return;
}

Assistant:

void verifyBufferRequirements (tcu::ResultCollector&					result,
							   const VkPhysicalDeviceMemoryProperties&	deviceMemoryProperties,
							   const VkMemoryRequirements&				requirements,
							   const VkMemoryRequirements&				allUsageFlagsRequirements,
							   const VkPhysicalDeviceLimits&			limits,
							   const VkBufferCreateFlags				bufferFlags,
							   const VkBufferUsageFlags					usage)
{
	if (result.check(requirements.memoryTypeBits != 0, "VkMemoryRequirements memoryTypeBits has no bits set"))
	{
		typedef std::vector<deUint32>::const_iterator	IndexIterator;
		const std::vector<deUint32>						usedMemoryTypeIndices			= bitsToIndices(requirements.memoryTypeBits);
		bool											deviceLocalMemoryFound			= false;
		bool											hostVisibleCoherentMemoryFound	= false;

		for (IndexIterator memoryTypeNdx = usedMemoryTypeIndices.begin(); memoryTypeNdx != usedMemoryTypeIndices.end(); ++memoryTypeNdx)
		{
			if (*memoryTypeNdx >= deviceMemoryProperties.memoryTypeCount)
			{
				result.fail("VkMemoryRequirements memoryTypeBits contains bits for non-existing memory types");
				continue;
			}

			const VkMemoryPropertyFlags	memoryPropertyFlags = deviceMemoryProperties.memoryTypes[*memoryTypeNdx].propertyFlags;

			if (memoryPropertyFlags & VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT)
				deviceLocalMemoryFound = true;

			if (memoryPropertyFlags & (VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT | VK_MEMORY_PROPERTY_HOST_COHERENT_BIT))
				hostVisibleCoherentMemoryFound = true;

			result.check((memoryPropertyFlags & VK_MEMORY_PROPERTY_LAZILY_ALLOCATED_BIT) == 0u,
				"Memory type includes VK_MEMORY_PROPERTY_LAZILY_ALLOCATED_BIT");
		}

		result.check(deIsPowerOfTwo64(static_cast<deUint64>(requirements.alignment)) == DE_TRUE,
			"VkMemoryRequirements alignment isn't power of two");

		if (usage & (VK_BUFFER_USAGE_UNIFORM_TEXEL_BUFFER_BIT | VK_BUFFER_USAGE_UNIFORM_TEXEL_BUFFER_BIT))
		{
			result.check(requirements.alignment >= limits.minTexelBufferOffsetAlignment,
				"VkMemoryRequirements alignment doesn't respect minTexelBufferOffsetAlignment");
		}

		if (usage & VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT)
		{
			result.check(requirements.alignment >= limits.minUniformBufferOffsetAlignment,
				"VkMemoryRequirements alignment doesn't respect minUniformBufferOffsetAlignment");
		}

		if (usage & VK_BUFFER_USAGE_STORAGE_BUFFER_BIT)
		{
			result.check(requirements.alignment >= limits.minStorageBufferOffsetAlignment,
				"VkMemoryRequirements alignment doesn't respect minStorageBufferOffsetAlignment");
		}

		result.check(deviceLocalMemoryFound,
			"None of the required memory types included VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT");

		result.check((bufferFlags & VK_BUFFER_CREATE_SPARSE_BINDING_BIT) || hostVisibleCoherentMemoryFound,
			"Required memory type doesn't include VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT and VK_MEMORY_PROPERTY_HOST_COHERENT_BIT");

		result.check((requirements.memoryTypeBits & allUsageFlagsRequirements.memoryTypeBits) == allUsageFlagsRequirements.memoryTypeBits,
			"Memory type bits aren't a superset of memory type bits for all usage flags combined");
	}
}